

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeSORegImmOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  DecodeStatus In;
  MCInst *in_RCX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint imm;
  uint type;
  uint Rm;
  uint Op;
  ARM_AM_ShiftOpc Shift;
  DecodeStatus S;
  undefined4 in_stack_ffffffffffffffcc;
  uint local_30;
  DecodeStatus local_4;
  
  local_4 = MCDisassembler_Success;
  uVar2 = fieldFromInstruction_4(in_ESI,0,4);
  uVar3 = fieldFromInstruction_4(in_ESI,5,2);
  uVar4 = fieldFromInstruction_4(in_ESI,7,5);
  In = DecodeGPRRegisterClass
                 (in_RCX,local_4,CONCAT44(in_stack_ffffffffffffffcc,uVar2),
                  (void *)CONCAT44(uVar3,uVar4));
  _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,In);
  if (_Var1) {
    local_30 = 2;
    switch(uVar3) {
    case 0:
      local_30 = 2;
      break;
    case 1:
      local_30 = 3;
      break;
    case 2:
      local_30 = 1;
      break;
    case 3:
      local_30 = 4;
    }
    if ((local_30 == 4) && (uVar4 == 0)) {
      local_30 = 5;
    }
    MCOperand_CreateImm0(in_RDI,(ulong)(local_30 | uVar4 << 3));
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeSORegImmOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	ARM_AM_ShiftOpc Shift;
	unsigned Op;
	unsigned Rm = fieldFromInstruction_4(Val, 0, 4);
	unsigned type = fieldFromInstruction_4(Val, 5, 2);
	unsigned imm = fieldFromInstruction_4(Val, 7, 5);

	// Register-immediate
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;

	Shift = ARM_AM_lsl;
	switch (type) {
		case 0:
			Shift = ARM_AM_lsl;
			break;
		case 1:
			Shift = ARM_AM_lsr;
			break;
		case 2:
			Shift = ARM_AM_asr;
			break;
		case 3:
			Shift = ARM_AM_ror;
			break;
	}

	if (Shift == ARM_AM_ror && imm == 0)
		Shift = ARM_AM_rrx;

	Op = Shift | (imm << 3);
	MCOperand_CreateImm0(Inst, Op);

	return S;
}